

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

void udata_getInfo_63(UDataMemory *pData,UDataInfo *pInfo)

{
  uint16_t *__src;
  DataHeader *pDVar1;
  uint16_t uVar2;
  ushort uVar3;
  
  if (pInfo != (UDataInfo *)0x0) {
    if ((pData == (UDataMemory *)0x0) || (pDVar1 = pData->pHeader, pDVar1 == (DataHeader *)0x0)) {
      pInfo->size = 0;
    }
    else {
      uVar2 = udata_getInfoSize_63(&pDVar1->info);
      uVar3 = pInfo->size;
      if (uVar2 < pInfo->size) {
        pInfo->size = uVar2;
        uVar3 = uVar2;
      }
      __src = &(pDVar1->info).reservedWord;
      memcpy(&pInfo->reservedWord,__src,(ulong)uVar3 - 2);
      if ((pDVar1->info).isBigEndian != '\0') {
        uVar3 = *__src;
        pInfo->reservedWord = uVar3 << 8 | uVar3 >> 8;
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_getInfo(UDataMemory *pData, UDataInfo *pInfo) {
    if(pInfo!=NULL) {
        if(pData!=NULL && pData->pHeader!=NULL) {
            const UDataInfo *info=&pData->pHeader->info;
            uint16_t dataInfoSize=udata_getInfoSize(info);
            if(pInfo->size>dataInfoSize) {
                pInfo->size=dataInfoSize;
            }
            uprv_memcpy((uint16_t *)pInfo+1, (const uint16_t *)info+1, pInfo->size-2);
            if(info->isBigEndian!=U_IS_BIG_ENDIAN) {
                /* opposite endianness */
                uint16_t x=info->reservedWord;
                pInfo->reservedWord=(uint16_t)((x<<8)|(x>>8));
            }
        } else {
            pInfo->size=0;
        }
    }
}